

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall mocker::ir::Interpreter::Interpreter(Interpreter *this,string *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_60;
  string local_40;
  
  (this->globalVars).
  super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->globalVars).
  super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->globalVars).
  super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->funcs)._M_h._M_buckets = &(this->funcs)._M_h._M_single_bucket;
  (this->funcs)._M_h._M_bucket_count = 1;
  (this->funcs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->funcs)._M_h._M_element_count = 0;
  (this->funcs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->funcs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->funcs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->externalFuncs)._M_h._M_buckets = &(this->externalFuncs)._M_h._M_single_bucket;
  (this->externalFuncs)._M_h._M_bucket_count = 1;
  (this->externalFuncs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->externalFuncs)._M_h._M_element_count = 0;
  (this->externalFuncs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->externalFuncs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->externalFuncs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalReg)._M_h._M_buckets = &(this->globalReg)._M_h._M_single_bucket;
  (this->globalReg)._M_h._M_bucket_count = 1;
  (this->globalReg)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalReg)._M_h._M_element_count = 0;
  (this->globalReg)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalReg)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalReg)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->ars).c.
  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
  ::_M_initialize_map((_Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                       *)&this->ars,0);
  (this->malloced).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->curSize = 0;
  (this->malloced).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->malloced).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  initExternalFuncs(this);
  local_60._M_dataplus._M_p = (source->_M_dataplus)._M_p;
  paVar1 = &source->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar1) {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&source->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60._M_string_length = source->_M_string_length;
  (source->_M_dataplus)._M_p = (pointer)paVar1;
  source->_M_string_length = 0;
  (source->field_2)._M_local_buf[0] = '\0';
  deleteComments(&local_40,this,&local_60);
  parse(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Interpreter::Interpreter(std::string source) {
  initExternalFuncs();
  parse(deleteComments(std::move(source)));
}